

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compilation.hpp
# Opt level: O1

void __thiscall
pstore::repo::compilation::
compilation<__gnu_cxx::__normal_iterator<pstore::repo::definition*,std::vector<pstore::repo::definition,std::allocator<pstore::repo::definition>>>>
          (compilation *this,typed_address<pstore::indirect_string> triple,size_type size,
          __normal_iterator<pstore::repo::definition_*,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_>
          first_member,
          __normal_iterator<pstore::repo::definition_*,_std::vector<pstore::repo::definition,_std::allocator<pstore::repo::definition>_>_>
          last_member)

{
  unsigned_long uVar1;
  
  *(undefined8 *)(this->signature_)._M_elems = 0x6e6f69386c706d43;
  (this->triple_).a_.a_ = (value_type)triple.a_.a_;
  this->size_ = size;
  this->padding1_ = 0;
  *(undefined8 *)&this->members_[0].digest.v_ = 0;
  *(undefined8 *)((long)&this->members_[0].digest.v_ + 8) = 0;
  this->members_[0].fext.addr.a_.a_ = 0;
  this->members_[0].fext.size = 0;
  this->members_[0].name.a_.a_ = 0;
  this->members_[0].field_3 = (anon_union_1_3_530f19d7_for_definition_3)0x0;
  this->members_[0].padding1 = '\0';
  this->members_[0].padding2 = 0;
  this->members_[0].padding3 = 0;
  uVar1 = unsigned_cast<long,unsigned_long,void>
                    (((long)last_member._M_current - (long)first_member._M_current >> 4) *
                     -0x5555555555555555);
  if (uVar1 != size) {
    assert_failed("unsigned_cast (std::distance (first_member, last_member)) == size",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/mcrepo/compilation.hpp"
                  ,0x111);
  }
  if (last_member._M_current != first_member._M_current) {
    memmove(this->members_,first_member._M_current,
            (long)last_member._M_current - (long)first_member._M_current);
    return;
  }
  return;
}

Assistant:

compilation::compilation (typed_address<indirect_string> const triple, size_type const size,
                                  Iterator const first_member, Iterator const last_member) noexcept
                : triple_{triple}
                , size_{size} {
            // Assignment to suppress a warning from clang that the field is not used.
            padding1_ = 0;
            PSTORE_STATIC_ASSERT (offsetof (compilation, signature_) == 0);
            PSTORE_STATIC_ASSERT (offsetof (compilation, triple_) == 8);
            PSTORE_STATIC_ASSERT (offsetof (compilation, size_) == 16);
            PSTORE_STATIC_ASSERT (offsetof (compilation, padding1_) == 20);
            PSTORE_STATIC_ASSERT (offsetof (compilation, members_) == 32);

            // This check can safely be an assertion because the method is private and alloc(),
            // the sole caller, performs a full run-time check of the size.
            PSTORE_ASSERT (unsigned_cast (std::distance (first_member, last_member)) == size);

            std::copy (first_member, last_member, this->begin ());
        }